

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Unit,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
* __thiscall
robin_hood::detail::
Table<true,80ul,std::__cxx11::string,Rml::Unit,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::doInsert<robin_hood::pair<std::__cxx11::string,Rml::Unit>>
          (pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Unit,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
           *__return_storage_ptr__,
          Table<true,80ul,std::__cxx11::string,Rml::Unit,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          *this,pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Unit>
                *keyval)

{
  char *pcVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  pointer pcVar5;
  size_t __n;
  undefined8 uVar6;
  int iVar7;
  size_t sVar8;
  long lVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  bool bVar11;
  ulong insertion_idx;
  uint8_t *puVar12;
  NodePtr pDVar13;
  string *this_00;
  uint uVar14;
  long lVar15;
  size_type *local_58;
  size_type local_50;
  size_type local_48;
  undefined8 uStack_40;
  Unit local_38;
  
  do {
    sVar8 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
            ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                          *)this,&keyval->first);
    uVar14 = ((uint)sVar8 & 0x1f) >> ((byte)this[0x2c] & 0x3f);
    iVar4 = *(int *)(this + 0x28);
    insertion_idx = sVar8 >> 5 & *(ulong *)(this + 0x18);
    lVar15 = *(long *)(this + 8);
    bVar3 = *(byte *)(lVar15 + insertion_idx);
    while (uVar14 = uVar14 + iVar4, uVar14 < bVar3) {
      pbVar2 = (byte *)(lVar15 + 1 + insertion_idx);
      insertion_idx = insertion_idx + 1;
      bVar3 = *pbVar2;
    }
    if (uVar14 == *(byte *)(lVar15 + insertion_idx)) {
      pcVar5 = (keyval->first)._M_dataplus._M_p;
      __n = (keyval->first)._M_string_length;
      pDVar13 = (NodePtr)(insertion_idx * 0x28 + *(long *)this);
      do {
        if ((__n == (pDVar13->mData).first._M_string_length) &&
           ((__n == 0 ||
            (iVar7 = bcmp(pcVar5,(pDVar13->mData).first._M_dataplus._M_p,__n), iVar7 == 0)))) {
          puVar12 = (uint8_t *)(lVar15 + insertion_idx);
          bVar11 = false;
          goto LAB_0025b5da;
        }
        uVar14 = uVar14 + iVar4;
        pbVar2 = (byte *)(lVar15 + 1 + insertion_idx);
        insertion_idx = insertion_idx + 1;
        pDVar13 = pDVar13 + 1;
      } while (uVar14 == *pbVar2);
    }
    if (*(ulong *)(this + 0x10) < *(ulong *)(this + 0x20)) {
      if (0xff < iVar4 + uVar14) {
        *(undefined8 *)(this + 0x20) = 0;
      }
      lVar9 = 1;
      do {
        lVar9 = lVar9 + -1;
        pcVar1 = (char *)(lVar15 + insertion_idx);
        lVar15 = lVar15 + 1;
      } while (*pcVar1 != '\0');
      this_00 = (string *)(*(long *)this + insertion_idx * 0x28);
      if (lVar9 == 0) {
        *(string **)this_00 = this_00 + 0x10;
        pcVar5 = (keyval->first)._M_dataplus._M_p;
        paVar10 = &(keyval->first).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 == paVar10) {
          uVar6 = *(undefined8 *)((long)&(keyval->first).field_2 + 8);
          *(size_type *)(this_00 + 0x10) = paVar10->_M_allocated_capacity;
          *(undefined8 *)(this_00 + 0x18) = uVar6;
        }
        else {
          *(pointer *)this_00 = pcVar5;
          *(size_type *)(this_00 + 0x10) = paVar10->_M_allocated_capacity;
        }
        *(size_type *)(this_00 + 8) = (keyval->first)._M_string_length;
        (keyval->first)._M_dataplus._M_p = (pointer)paVar10;
        (keyval->first)._M_string_length = 0;
        (keyval->first).field_2._M_local_buf[0] = '\0';
        *(Unit *)(this_00 + 0x20) = keyval->second;
      }
      else {
        Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Unit,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::shiftUp((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Unit,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,insertion_idx - lVar9,insertion_idx);
        local_58 = (size_type *)(keyval->first)._M_dataplus._M_p;
        paVar10 = &(keyval->first).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58 == paVar10) {
          local_48 = paVar10->_M_allocated_capacity;
          uStack_40 = *(undefined8 *)((long)&(keyval->first).field_2 + 8);
          local_58 = &local_48;
        }
        else {
          local_48 = paVar10->_M_allocated_capacity;
        }
        local_50 = (keyval->first)._M_string_length;
        (keyval->first)._M_dataplus._M_p = (pointer)paVar10;
        (keyval->first)._M_string_length = 0;
        (keyval->first).field_2._M_local_buf[0] = '\0';
        local_38 = keyval->second;
        std::__cxx11::string::operator=(this_00,(string *)&local_58);
        *(Unit *)(this_00 + 0x20) = local_38;
        if (local_58 != &local_48) {
          operator_delete(local_58,local_48 + 1);
        }
      }
      *(char *)(*(long *)(this + 8) + insertion_idx) = (char)uVar14;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      pDVar13 = (NodePtr)(insertion_idx * 0x28 + *(long *)this);
      puVar12 = (uint8_t *)(insertion_idx + *(long *)(this + 8));
      bVar11 = true;
LAB_0025b5da:
      (__return_storage_ptr__->first).mKeyVals = pDVar13;
      (__return_storage_ptr__->first).mInfo = puVar12;
      __return_storage_ptr__->second = bVar11;
      return __return_storage_ptr__;
    }
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Unit,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::increase_size((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Unit,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this);
  } while( true );
}

Assistant:

std::pair<iterator, bool> doInsert(Arg&& keyval) {
        while (true) {
            size_t idx{};
            InfoType info{};
            keyToIdx(getFirstConst(keyval), &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(getFirstConst(keyval), mKeyVals[idx].getFirst())) {
                    // key already exists, do NOT insert.
                    // see http://en.cppreference.com/w/cpp/container/unordered_map/insert
                    return std::make_pair<iterator, bool>(iterator(mKeyVals + idx, mInfo + idx),
                                                          false);
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                increase_size();
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            auto& l = mKeyVals[insertion_idx];
            if (idx == insertion_idx) {
                ::new (static_cast<void*>(&l)) Node(*this, std::forward<Arg>(keyval));
            } else {
                shiftUp(idx, insertion_idx);
                l = Node(*this, std::forward<Arg>(keyval));
            }

            // put at empty spot
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);

            ++mNumElements;
            return std::make_pair(iterator(mKeyVals + insertion_idx, mInfo + insertion_idx), true);
        }
    }